

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  bool bVar1;
  pointer __dest;
  
  if (size < 0) {
    bVar1 = false;
  }
  else {
    if (*(int *)&this->buffer_end_ - *(int *)&this->buffer_ < size) {
      bVar1 = ReadStringFallback(this,buffer,size);
      return bVar1;
    }
    std::__cxx11::string::resize((ulong)buffer);
    bVar1 = true;
    if (size != 0) {
      if (buffer->_M_string_length == 0) {
        __dest = (pointer)0x0;
      }
      else {
        __dest = (buffer->_M_dataplus)._M_p;
      }
      memcpy(__dest,this->buffer_,(ulong)(uint)size);
      this->buffer_ = this->buffer_ + (uint)size;
    }
  }
  return bVar1;
}

Assistant:

bool CodedInputStream::ReadString(string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied
  return InternalReadStringInline(buffer, size);
}